

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

uint64_t absl::anon_unknown_0::ShiftRightAndRound
                   (uint128 value,int shift,bool input_exact,Nonnull<bool_*> output_exact)

{
  uint128 lhs;
  uint128 lhs_00;
  uint128 lhs_01;
  uint128 lhs_02;
  uint128 rhs;
  uint128 rhs_00;
  uint128 rhs_01;
  uint128 rhs_02;
  uint128 rhs_03;
  uint128 rhs_04;
  uint128 lhs_03;
  uint128 rhs_05;
  uint128 lhs_04;
  uint128 rhs_06;
  uint128 lhs_05;
  bool bVar1;
  byte in_CL;
  int in_EDX;
  uint64_t in_RSI;
  uint64_t in_RDI;
  byte *in_R8;
  uint128 uVar2;
  uint128 shifted_bits;
  uint128 halfway_point;
  uint128 shift_mask;
  undefined8 in_stack_fffffffffffffe48;
  int v;
  uint128 *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar3;
  int in_stack_fffffffffffffe6c;
  undefined4 uVar4;
  uint128 *in_stack_fffffffffffffe70;
  uint64_t uVar5;
  uint64_t in_stack_fffffffffffffe78;
  uint128 in_stack_fffffffffffffe80;
  uint128 local_108;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  uint128 local_b8;
  uint128 local_98;
  uint128 local_68;
  uint128 local_58;
  uint128 local_38;
  byte *local_28;
  byte local_1d;
  uint128 local_18;
  unsigned_long local_8;
  
  local_1d = in_CL & 1;
  if (in_EDX < 1) {
    *in_R8 = local_1d;
    lhs.hi_._0_4_ = in_stack_fffffffffffffe68;
    lhs.lo_ = in_stack_fffffffffffffe60;
    lhs.hi_._4_4_ = in_stack_fffffffffffffe6c;
    local_38 = absl::operator<<(lhs,in_stack_fffffffffffffe5c);
    local_8 = uint128::operator_cast_to_unsigned_long(&local_38);
  }
  else if (in_EDX < 0x80) {
    *in_R8 = 1;
    v = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    local_28 = in_R8;
    local_18.lo_ = in_RDI;
    local_18.hi_ = in_RSI;
    uint128::uint128(in_stack_fffffffffffffe50,v);
    lhs_00.hi_._0_4_ = in_stack_fffffffffffffe68;
    lhs_00.lo_ = in_stack_fffffffffffffe60;
    lhs_00.hi_._4_4_ = in_stack_fffffffffffffe6c;
    local_68 = absl::operator<<(lhs_00,in_stack_fffffffffffffe5c);
    uint128::uint128(in_stack_fffffffffffffe50,v);
    rhs_02.hi_ = in_stack_fffffffffffffe78;
    rhs_02.lo_ = (uint64_t)in_stack_fffffffffffffe70;
    local_58 = absl::operator-(in_stack_fffffffffffffe80,rhs_02);
    uint128::uint128(in_stack_fffffffffffffe50,v);
    lhs_01.hi_._0_4_ = in_stack_fffffffffffffe68;
    lhs_01.lo_ = in_stack_fffffffffffffe60;
    lhs_01.hi_._4_4_ = in_stack_fffffffffffffe6c;
    local_98 = absl::operator<<(lhs_01,in_stack_fffffffffffffe5c);
    local_c8 = local_18.lo_;
    local_c0 = local_18.hi_;
    local_d8 = local_58.lo_;
    local_d0 = local_58.hi_;
    rhs_03.hi_ = in_stack_fffffffffffffe78;
    rhs_03.lo_ = (uint64_t)in_stack_fffffffffffffe70;
    local_b8 = operator&(in_stack_fffffffffffffe80,rhs_03);
    uint128::operator>>=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_e8 = local_b8.lo_;
    local_e0 = local_b8.hi_;
    local_f8 = local_98.lo_;
    local_f0 = local_98.hi_;
    lhs_02.hi_._0_4_ = in_stack_fffffffffffffe68;
    lhs_02.lo_ = in_stack_fffffffffffffe60;
    lhs_02.hi_._4_4_ = in_stack_fffffffffffffe6c;
    uVar2.hi_._0_4_ = in_stack_fffffffffffffe58;
    uVar2.lo_ = (uint64_t)in_stack_fffffffffffffe50;
    uVar2.hi_._4_4_ = in_stack_fffffffffffffe5c;
    bVar1 = operator>(lhs_02,uVar2);
    if (bVar1) {
      uint128::uint128(in_stack_fffffffffffffe50,v);
      rhs_04.hi_ = in_stack_fffffffffffffe78;
      rhs_04.lo_ = (uint64_t)in_stack_fffffffffffffe70;
      local_108 = absl::operator+(in_stack_fffffffffffffe80,rhs_04);
      local_8 = uint128::operator_cast_to_unsigned_long(&local_108);
    }
    else {
      lhs_03.hi_ = in_stack_fffffffffffffe78;
      lhs_03.lo_ = (uint64_t)in_stack_fffffffffffffe70;
      rhs.hi_._0_4_ = in_stack_fffffffffffffe68;
      rhs.lo_ = in_stack_fffffffffffffe60;
      rhs.hi_._4_4_ = in_stack_fffffffffffffe6c;
      bVar1 = absl::operator==(lhs_03,rhs);
      if (bVar1) {
        uint128::uint128(in_stack_fffffffffffffe50,v);
        rhs_05.hi_ = in_stack_fffffffffffffe78;
        rhs_05.lo_ = (uint64_t)in_stack_fffffffffffffe70;
        operator&(in_stack_fffffffffffffe80,rhs_05);
        uint128::uint128(in_stack_fffffffffffffe50,v);
        lhs_04.hi_ = in_stack_fffffffffffffe78;
        lhs_04.lo_ = (uint64_t)in_stack_fffffffffffffe70;
        rhs_00.hi_._0_4_ = in_stack_fffffffffffffe68;
        rhs_00.lo_ = in_stack_fffffffffffffe60;
        rhs_00.hi_._4_4_ = in_stack_fffffffffffffe6c;
        bVar1 = absl::operator==(lhs_04,rhs_00);
        if ((bVar1) || ((local_1d & 1) == 0)) {
          uint128::operator++(in_stack_fffffffffffffe50);
        }
        local_8 = uint128::operator_cast_to_unsigned_long(&local_18);
      }
      else {
        if ((local_1d & 1) == 0) {
          uVar3 = (undefined4)local_b8.lo_;
          uVar4 = local_b8.lo_._4_4_;
          uVar5 = local_b8.hi_;
          uint128::uint128((uint128 *)local_98.hi_,local_98.lo_._4_4_);
          rhs_06.hi_ = in_stack_fffffffffffffe78;
          rhs_06.lo_ = uVar5;
          uVar2 = absl::operator-(in_stack_fffffffffffffe80,rhs_06);
          lhs_05.hi_ = in_stack_fffffffffffffe78;
          lhs_05.lo_ = uVar5;
          rhs_01.hi_._0_4_ = uVar3;
          rhs_01.lo_ = uVar2.hi_;
          rhs_01.hi_._4_4_ = uVar4;
          bVar1 = absl::operator==(lhs_05,rhs_01);
          if (bVar1) {
            *local_28 = 0;
          }
        }
        local_8 = uint128::operator_cast_to_unsigned_long(&local_18);
      }
    }
  }
  else {
    *in_R8 = 1;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t ShiftRightAndRound(uint128 value, int shift, bool input_exact,
                            absl::Nonnull<bool*> output_exact) {
  if (shift <= 0) {
    *output_exact = input_exact;
    return static_cast<uint64_t>(value << -shift);
  }
  if (shift >= 128) {
    // Exponent is so small that we are shifting away all significant bits.
    // Answer will not be representable, even as a subnormal, so return a zero
    // mantissa (which represents underflow).
    *output_exact = true;
    return 0;
  }

  *output_exact = true;
  const uint128 shift_mask = (uint128(1) << shift) - 1;
  const uint128 halfway_point = uint128(1) << (shift - 1);

  const uint128 shifted_bits = value & shift_mask;
  value >>= shift;
  if (shifted_bits > halfway_point) {
    // Shifted bits greater than 10000... require rounding up.
    return static_cast<uint64_t>(value + 1);
  }
  if (shifted_bits == halfway_point) {
    // In exact mode, shifted bits of 10000... mean we're exactly halfway
    // between two numbers, and we must round to even.  So only round up if
    // the low bit of `value` is set.
    //
    // In inexact mode, the nonzero error means the actual value is greater
    // than the halfway point and we must always round up.
    if ((value & 1) == 1 || !input_exact) {
      ++value;
    }
    return static_cast<uint64_t>(value);
  }
  if (!input_exact && shifted_bits == halfway_point - 1) {
    // Rounding direction is unclear, due to error.
    *output_exact = false;
  }
  // Otherwise, round down.
  return static_cast<uint64_t>(value);
}